

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode cf_h2_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  Curl_cfilter *pCVar3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (query == 1) {
    puVar1 = (undefined8 *)cf->ctx;
    uVar2 = puVar1[2];
    puVar1[2] = data;
    iVar4 = nghttp2_session_check_request_allowed((nghttp2_session *)*puVar1);
    if (iVar4 == 0) {
      uVar6 = (cf->conn->easyq).size;
    }
    else {
      uVar6 = (ulong)*(uint *)(puVar1 + 1);
    }
    uVar7 = 0x7fffffff;
    if (uVar6 < 0x7fffffff) {
      uVar7 = uVar6;
    }
    *pres1 = (int)uVar7;
    *(undefined8 *)((long)cf->ctx + 0x10) = uVar2;
    CVar5 = CURLE_OK;
  }
  else {
    pCVar3 = cf->next;
    if (pCVar3 != (Curl_cfilter *)0x0) {
      CVar5 = (*pCVar3->cft->query)(pCVar3,data,query,pres1,pres2);
      return CVar5;
    }
    CVar5 = CURLE_UNKNOWN_OPTION;
  }
  return CVar5;
}

Assistant:

static CURLcode cf_h2_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct cf_call_data save;
  size_t effective_max;

  switch(query) {
  case CF_QUERY_MAX_CONCURRENT:
    DEBUGASSERT(pres1);

    CF_DATA_SAVE(save, cf, data);
    if(nghttp2_session_check_request_allowed(ctx->h2) == 0) {
      /* the limit is what we have in use right now */
      effective_max = CONN_INUSE(cf->conn);
    }
    else {
      effective_max = ctx->max_concurrent_streams;
    }
    *pres1 = (effective_max > INT_MAX)? INT_MAX : (int)effective_max;
    CF_DATA_RESTORE(cf, save);
    return CURLE_OK;
  default:
    break;
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}